

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O2

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>(Op op,SquareMatrix<float> *A)

{
  long lVar1;
  undefined4 uVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  
  if (op != NoTrans) {
    lVar3 = A->size_;
    lVar6 = 1;
    if (1 < lVar3) {
      lVar6 = lVar3;
    }
    lVar8 = lVar3 * 4;
    lVar1 = lVar3 * 4 + 4;
    lVar7 = 0;
    lVar9 = 0;
    lVar5 = lVar3;
    while (lVar9 != lVar6 + -1) {
      lVar9 = lVar9 + 1;
      pfVar4 = (A->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      puVar10 = (undefined4 *)((long)pfVar4 + lVar8);
      for (lVar11 = 1; lVar5 != lVar11; lVar11 = lVar11 + 1) {
        uVar2 = *(undefined4 *)((long)pfVar4 + lVar11 * 4 + lVar7);
        *(undefined4 *)((long)pfVar4 + lVar11 * 4 + lVar7) = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + lVar3;
      }
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + lVar1;
      lVar7 = lVar7 + lVar1;
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }